

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void do_complete(connectdata *conn)

{
  Curl_easy *data;
  int iVar1;
  
  data = conn->data;
  (data->req).chunk = false;
  iVar1 = conn->writesockfd;
  if (conn->writesockfd < conn->sockfd) {
    iVar1 = conn->sockfd;
  }
  (data->req).maxfd = iVar1 + 1;
  Curl_pgrsTime(data,TIMER_PRETRANSFER);
  return;
}

Assistant:

static void do_complete(struct connectdata *conn)
{
  conn->data->req.chunk=FALSE;
  conn->data->req.maxfd = (conn->sockfd>conn->writesockfd?
                           conn->sockfd:conn->writesockfd)+1;
  Curl_pgrsTime(conn->data, TIMER_PRETRANSFER);
}